

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_send(Curl_easy *data,void *buffer,size_t buflen,size_t *n)

{
  CURLcode CVar1;
  CURLcode CVar2;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  curl_socket_t local_34;
  connectdata *local_30;
  size_t local_28;
  
  local_30 = (connectdata *)0x0;
  CVar1 = easy_connection(data,&local_34,&local_30);
  if (CVar1 == CURLE_OK) {
    *n = 0;
    CVar2 = Curl_write(local_30,local_34,buffer,buflen,(ssize_t *)&local_28);
    if (local_28 == 0xffffffffffffffff) {
      CVar1 = CURLE_SEND_ERROR;
    }
    else {
      CVar1 = CURLE_AGAIN;
      if (CVar2 != CURLE_OK || local_28 != 0) {
        *n = local_28;
        CVar1 = CVar2;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode curl_easy_send(struct Curl_easy *data, const void *buffer,
                        size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode result;
  ssize_t n1;
  struct connectdata *c = NULL;

  result = easy_connection(data, &sfd, &c);
  if(result)
    return result;

  *n = 0;
  result = Curl_write(c, sfd, buffer, buflen, &n1);

  if(n1 == -1)
    return CURLE_SEND_ERROR;

  /* detect EAGAIN */
  if(!result && !n1)
    return CURLE_AGAIN;

  *n = (size_t)n1;

  return result;
}